

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare::operator()
          (FileCompare *this,FileEntry *a,StringPiece b)

{
  pointer __s1;
  ulong size;
  int iVar1;
  ulong uVar2;
  ulong __n;
  
  uVar2 = b.length_;
  __s1 = (a->encoded_name)._M_dataplus._M_p;
  size = (a->encoded_name)._M_string_length;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  __n = uVar2;
  if (size < uVar2) {
    __n = size;
  }
  iVar1 = memcmp(__s1,b.ptr_,__n);
  return iVar1 < 0 || iVar1 == 0 && size < uVar2;
}

Assistant:

bool operator()(const FileEntry& a, StringPiece b) const {
      return a.name(index) < b;
    }